

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>::
find<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_const,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
           *this,ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
                 table,StringPtr *params)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  Entry *pEVar7;
  ArrayPtr<const_char> *in_R8;
  uint uVar8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  
  pEVar7 = table.ptr;
  aVar6.value = table.size_;
  if (*(long *)&(pEVar7->value).prefixLength != 0) {
    uVar4 = hashCode<kj::StringPtr&>((StringPtr *)in_R8);
    lVar5 = *(long *)&(pEVar7->value).prefixLength;
    uVar8 = (int)lVar5 - 1U & uVar4;
    aVar6 = extraout_RDX;
    while( true ) {
      uVar9 = (ulong)uVar8;
      lVar2 = *(long *)&pEVar7->value;
      iVar1 = *(int *)(lVar2 + 4 + uVar9 * 8);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)(lVar2 + uVar9 * 8) == uVar4)) {
        bVar3 = ArrayPtr<const_char>::operator==
                          ((ArrayPtr<const_char> *)((ulong)(iVar1 - 2) * 0x38 + table.size_),in_R8);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          iVar1 = *(int *)(lVar2 + 4 + uVar9 * 8);
          *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
          goto LAB_00294428;
        }
        lVar5 = *(long *)&(pEVar7->value).prefixLength;
      }
      uVar8 = (uint)(uVar9 + 1);
      if (uVar9 + 1 == lVar5) {
        uVar8 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
           )0x0;
LAB_00294428:
  MVar10.ptr.field_1.value = aVar6.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }